

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

string * __thiscall
TestNLHandler::MakeVarArg
          (string *__return_storage_ptr__,TestNLHandler *this,string *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char *begin;
  MemoryWriter w;
  
  w.super_BasicWriter<char>.buffer_ = &w.buffer_.super_Buffer<char>;
  w.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002b01a0;
  w.buffer_.super_Buffer<char>.ptr_ = w.buffer_.data_;
  w.buffer_.super_Buffer<char>.size_ = 0;
  w.buffer_.super_Buffer<char>.capacity_ = 500;
  w.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002b01e8;
  begin = (op->_M_dataplus)._M_p;
  fmt::Buffer<char>::append<char>
            (w.super_BasicWriter<char>.buffer_,begin,begin + op->_M_string_length);
  fmt::BasicWriter<char>::operator<<(&w.super_BasicWriter<char>,'(');
  WriteList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&w.super_BasicWriter<char>,args);
  fmt::BasicWriter<char>::operator<<(&w.super_BasicWriter<char>,')');
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&w.super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&w);
  return __return_storage_ptr__;
}

Assistant:

std::string MakeVarArg(std::string op, const std::vector<std::string> &args) {
    fmt::MemoryWriter w;
    w << op << '(';
    WriteList(w, args);
    w << ')';
    return w.str();
  }